

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

void __thiscall
amrex::CoordSys::GetEdgeLoc
          (CoordSys *this,Vector<double,_std::allocator<double>_> *loc,Box *region,int dir)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  int *piVar4;
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar5;
  int in_ECX;
  int iVar6;
  Box *in_RDX;
  Vector<double,_std::allocator<double>_> *in_RDI;
  double i_00;
  int i;
  Real off;
  int len;
  int *hi;
  int *lo;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  
  piVar4 = Box::loVect(in_RDX);
  this_00 = (vector<double,_std::allocator<double>_> *)Box::hiVect(in_RDX);
  iVar6 = (*(int *)((long)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + (long)in_ECX * 4) - piVar4[in_ECX]) +
          2;
  pdVar1 = (&(in_RDI->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish)[in_ECX];
  pdVar2 = (&in_RDI[1].super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish)[in_ECX];
  iVar3 = piVar4[in_ECX];
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,CONCAT44(iVar6,in_stack_ffffffffffffffc8));
  for (local_44 = 0; local_44 < iVar6; local_44 = local_44 + 1) {
    i_00 = (double)(&in_RDI[1].super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish)[in_ECX] * (double)local_44 +
           (double)pdVar2 * (double)iVar3 + (double)pdVar1;
    pdVar5 = Vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)i_00);
    *pdVar5 = i_00;
  }
  return;
}

Assistant:

void
CoordSys::GetEdgeLoc (Vector<Real>& loc,
                      const Box&    region,
                      int           dir) const
{
    AMREX_ASSERT(ok);
    AMREX_ASSERT(region.cellCentered());
    const int* lo = region.loVect();
    const int* hi = region.hiVect();
    int len       = hi[dir] - lo[dir] + 2;
    Real off      = offset[dir] + dx[dir]*lo[dir];
    loc.resize(len);
    AMREX_PRAGMA_SIMD
    for (int i = 0; i < len; i++)
    {
        loc[i] = off + dx[dir]*i;
    }
}